

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall
CGameClient::DoTeamChangeMessage(CGameClient *this,char *pName,int ClientID,int Team)

{
  char *pcVar1;
  char *pStr;
  long in_FS_OFFSET;
  char aLabel [64];
  char aBuf [128];
  char acStack_e8 [64];
  char local_a8 [136];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetPlayerLabel(this,acStack_e8,0x40,ClientID,pName);
  if (((this->m_GameInfo).m_GameFlags & 1) == 0) {
    pStr = "\'%s\' joined the spectators";
    if (Team == 0) {
      pStr = "\'%s\' joined the game";
    }
  }
  else {
    pcVar1 = "\'%s\' joined the spectators";
    if (Team == 1) {
      pcVar1 = "\'%s\' joined the blue team";
    }
    pStr = "\'%s\' joined the red team";
    if (Team != 0) {
      pStr = pcVar1;
    }
  }
  pcVar1 = Localize(pStr,"");
  str_format(local_a8,0x80,pcVar1);
  CChat::AddLine(this->m_pChat,local_a8,-1,0,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::DoTeamChangeMessage(const char *pName, int ClientID, int Team)
{
	char aBuf[128];
	char aLabel[64];
	GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, pName);
	switch(GetStrTeam(Team, m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS))
	{
	case STR_TEAM_GAME: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the game"), aLabel); break;
	case STR_TEAM_RED: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the red team"), aLabel); break;
	case STR_TEAM_BLUE: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the blue team"), aLabel); break;
	case STR_TEAM_SPECTATORS: str_format(aBuf, sizeof(aBuf), Localize("'%s' joined the spectators"), aLabel); break;
	}
	m_pChat->AddLine(aBuf);
}